

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction_base.cpp
# Opt level: O2

TransactionStructApiBase * __thiscall
cfd::js::api::TransactionStructApiBase::
ConvertSignDataStructToSignParameter<cfd::js::api::PubkeySignDataStruct>
          (TransactionStructApiBase *this,PubkeySignDataStruct *sign_data)

{
  bool bVar1;
  bool is_rangeproof;
  bool bVar2;
  SignDataType SVar3;
  Script *this_00;
  allocator local_a1;
  Script local_a0;
  undefined1 local_68 [40];
  TransactionStructApiBase local_40 [12];
  SigHashType local_34 [12];
  
  bVar2 = std::operator==(&sign_data->type,"auto");
  if (bVar2) {
    if (sign_data->der_encode == true) {
      bVar2 = sign_data->sighash_anyone_can_pay;
      bVar1 = sign_data->sighash_rangeproof;
      std::__cxx11::string::string((string *)&local_a0,"",(allocator *)local_68);
      ConvertSigHashType(local_40,&sign_data->sighash_type,bVar2,bVar1,false,(string *)&local_a0);
      cfd::SignParameter::SignParameter((SignParameter *)this,sign_data,1,local_40);
      std::__cxx11::string::~string((string *)&local_a0);
      return this;
    }
    cfd::core::SigHashType::SigHashType(local_34,kSigHashAll,false,false);
    cfd::SignParameter::SignParameter((SignParameter *)this,sign_data,0,local_34);
    return this;
  }
  SVar3 = ConvertToSignDataType(&sign_data->type);
  switch(SVar3) {
  case kSign:
    cfd::core::ByteData::ByteData((ByteData *)local_68,(string *)sign_data);
    bVar2 = sign_data->der_encode;
    bVar1 = sign_data->sighash_anyone_can_pay;
    is_rangeproof = sign_data->sighash_rangeproof;
    std::__cxx11::string::string((string *)&local_a0,"",&local_a1);
    ConvertSigHashType((TransactionStructApiBase *)(local_68 + 0x1c),&sign_data->sighash_type,bVar1,
                       is_rangeproof,false,(string *)&local_a0);
    cfd::SignParameter::SignParameter((SignParameter *)this,local_68,bVar2,local_68 + 0x1c);
    std::__cxx11::string::~string((string *)&local_a0);
    this_00 = (Script *)local_68;
    goto LAB_008b5e9e;
  default:
    cfd::core::ByteData::ByteData((ByteData *)&local_a0,(string *)sign_data);
    cfd::SignParameter::SignParameter((SignParameter *)this,(ByteData *)&local_a0);
    break;
  case kPubkey:
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_a0,(string *)sign_data);
    cfd::SignParameter::SignParameter((SignParameter *)this,(Pubkey *)&local_a0);
    break;
  case kRedeemScript:
    cfd::core::Script::Script(&local_a0,(string *)sign_data);
    cfd::SignParameter::SignParameter((SignParameter *)this,&local_a0);
    core::Script::~Script(&local_a0);
    return this;
  case kOpCode:
    cfd::core::ScriptOperator::Get((string *)&local_a0);
    cfd::SignParameter::SignParameter((SignParameter *)this,(ScriptOperator *)&local_a0);
    core::ScriptOperator::~ScriptOperator((ScriptOperator *)&local_a0);
    return this;
  }
  this_00 = &local_a0;
LAB_008b5e9e:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  return this;
}

Assistant:

SignParameter TransactionStructApiBase::ConvertSignDataStructToSignParameter(
    const SignStructClass& sign_data) {
  if (sign_data.type == "auto") {
    // insert text directly
    if (sign_data.der_encode) {
      return SignParameter(
          sign_data.hex, sign_data.der_encode,
          TransactionStructApiBase::ConvertSigHashType(
              sign_data.sighash_type, sign_data.sighash_anyone_can_pay,
              sign_data.sighash_rangeproof));
    } else {
      return SignParameter(sign_data.hex);
    }
  }
  SignDataType data_type = ConvertToSignDataType(sign_data.type);
  switch (data_type) {
    case kSign:
      return SignParameter(
          ByteData(sign_data.hex), sign_data.der_encode,
          TransactionStructApiBase::ConvertSigHashType(
              sign_data.sighash_type, sign_data.sighash_anyone_can_pay,
              sign_data.sighash_rangeproof));
    case kOpCode:
      return SignParameter(ScriptOperator::Get(sign_data.hex));
    case kPubkey:
      return SignParameter(Pubkey(sign_data.hex));
    case kRedeemScript:
      return SignParameter(Script(sign_data.hex));
    case kBinary:
      // fall-through
    default:
      return SignParameter(ByteData(sign_data.hex));
  }
}